

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionController::AddWitnessStack
          (TransactionController *this,Txid *txid,uint32_t vout,string *signed_signature_hash,
          Pubkey *pubkey)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signed_signature_hashes;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&signed_signature_hashes,2,(allocator_type *)&local_50);
  std::__cxx11::string::_M_assign
            ((string *)
             signed_signature_hashes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  core::Pubkey::GetHex_abi_cxx11_(&local_50,pubkey);
  std::__cxx11::string::operator=
            ((string *)
             (signed_signature_hashes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  AddWitnessStack(this,txid,vout,&signed_signature_hashes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&signed_signature_hashes);
  return;
}

Assistant:

void TransactionController::AddWitnessStack(
    const Txid& txid, uint32_t vout, const std::string& signed_signature_hash,
    const Pubkey& pubkey) {
  std::vector<std::string> signed_signature_hashes(2);
  signed_signature_hashes[0] = signed_signature_hash;
  signed_signature_hashes[1] = pubkey.GetHex();
  AddWitnessStack(txid, vout, signed_signature_hashes);
}